

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

bool __thiscall CKey::Derive(CKey *this,CKey *keyChild,ChainCode *ccChild,uint nChild,ChainCode *cc)

{
  long lVar1;
  array<unsigned_char,_32UL> *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  long in_FS_OFFSET;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vout;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->keydata)._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
      (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x125,
                  "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const");
  }
  if (this->fCompressed == false) {
    __assert_fail("IsCompressed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x126,
                  "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const");
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            (&vout,0x40,(allocator_type *)&pubkey);
  if ((int)nChild < 0) {
    paVar2 = (this->keydata)._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    if (paVar2 == (array<unsigned_char,_32UL> *)0x0) {
      __assert_fail("size() == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x12d,
                    "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const")
      ;
    }
    BIP32Hash(cc,nChild,'\0',paVar2->_M_elems,
              vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  }
  else {
    GetPubKey(&pubkey,this);
    if ((pubkey.vch[0] & 0xfe) != 2) {
      __assert_fail("pubkey.size() == CPubKey::COMPRESSED_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x12a,
                    "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const")
      ;
    }
    BIP32Hash(cc,nChild,pubkey.vch[0],pubkey.vch + 1,
              vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  }
  uVar3 = *(undefined8 *)
           (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x20);
  uVar4 = *(undefined8 *)
           (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x28);
  uVar5 = *(undefined8 *)
           (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x38);
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x10) =
       *(undefined8 *)
        (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x30);
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar5;
  *(undefined8 *)(ccChild->super_base_blob<256U>).m_data._M_elems = uVar3;
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 8) = uVar4;
  paVar2 = (this->keydata)._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  Set<std::byte_const*>(keyChild,paVar2->_M_elems,paVar2[1]._M_elems,true);
  iVar6 = secp256k1_ec_seckey_tweak_add
                    (secp256k1_context_sign,
                     ((keyChild->keydata)._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
                     ->_M_elems,
                     vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (iVar6 == 0) {
    ClearKeyData(keyChild);
  }
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            (&vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar6 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::Derive(CKey& keyChild, ChainCode &ccChild, unsigned int nChild, const ChainCode& cc) const {
    assert(IsValid());
    assert(IsCompressed());
    std::vector<unsigned char, secure_allocator<unsigned char>> vout(64);
    if ((nChild >> 31) == 0) {
        CPubKey pubkey = GetPubKey();
        assert(pubkey.size() == CPubKey::COMPRESSED_SIZE);
        BIP32Hash(cc, nChild, *pubkey.begin(), pubkey.begin()+1, vout.data());
    } else {
        assert(size() == 32);
        BIP32Hash(cc, nChild, 0, UCharCast(begin()), vout.data());
    }
    memcpy(ccChild.begin(), vout.data()+32, 32);
    keyChild.Set(begin(), begin() + 32, true);
    bool ret = secp256k1_ec_seckey_tweak_add(secp256k1_context_sign, (unsigned char*)keyChild.begin(), vout.data());
    if (!ret) keyChild.ClearKeyData();
    return ret;
}